

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::JsonReporter::listTags
          (JsonReporter *this,vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags)

{
  _Rb_tree_node_base *p_Var1;
  set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_> *__range3;
  pointer pTVar2;
  int __fd;
  _Elt_pointer pJVar3;
  ios_base *this_00;
  StringRef key;
  JsonArrayWriter writer;
  JsonArrayWriter aliases_writer;
  JsonObjectWriter tag_writer;
  StringRef alias;
  char local_221;
  ios_base *local_220;
  pointer local_218;
  JsonArrayWriter local_210;
  JsonArrayWriter local_1f8;
  JsonObjectWriter local_1e0;
  undefined1 local_1c8 [136];
  ios_base local_140 [264];
  uint64_t local_38;
  
  if (this->m_startedListing == false) {
    key.m_size = 8;
    key.m_start = "listings";
    startObject(this,key);
  }
  this->m_startedListing = true;
  pJVar3 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar3 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar3 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonObjectWriter::write((JsonObjectWriter *)local_1c8,(int)pJVar3 + -0x18,"tags",4);
  local_210.m_os = (ostream *)local_1c8._0_8_;
  local_210.m_indent_level = local_38;
  local_210.m_should_comma = false;
  local_210.m_active = true;
  local_1e0.m_os._0_1_ = 0x5b;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8._0_8_,(char *)&local_1e0,1);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 8));
  std::ios_base::~ios_base(local_140);
  pTVar2 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_218 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  if (pTVar2 != local_218) {
    this_00 = local_140;
    local_220 = this_00;
    do {
      JsonArrayWriter::writeObject(&local_1e0,&local_210);
      __fd = (int)&local_1e0;
      JsonObjectWriter::write((JsonObjectWriter *)local_1c8,__fd,"aliases",7);
      local_1f8.m_os = (ostream *)local_1c8._0_8_;
      local_1f8.m_indent_level = local_38;
      local_1f8.m_should_comma = false;
      local_1f8.m_active = true;
      local_221 = '[';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8._0_8_,&local_221,1);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 8));
      std::ios_base::~ios_base(this_00);
      for (p_Var1 = (pTVar2->spellings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var1 != &(pTVar2->spellings)._M_t._M_impl.super__Rb_tree_header;
          p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
        local_1c8._0_8_ = *(undefined8 *)(p_Var1 + 1);
        local_1c8._8_8_ = p_Var1[1]._M_parent;
        JsonArrayWriter::writeImpl<Catch::StringRef>(&local_1f8,(StringRef *)local_1c8);
      }
      JsonArrayWriter::~JsonArrayWriter(&local_1f8);
      JsonObjectWriter::write((JsonObjectWriter *)local_1c8,__fd,"count",5);
      JsonValueWriter::writeImpl<unsigned_long,void>
                ((JsonValueWriter *)local_1c8,&pTVar2->count,false);
      this_00 = local_220;
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 8));
      std::ios_base::~ios_base(this_00);
      JsonObjectWriter::~JsonObjectWriter(&local_1e0);
      pTVar2 = pTVar2 + 1;
    } while (pTVar2 != local_218);
  }
  JsonArrayWriter::~JsonArrayWriter(&local_210);
  return;
}

Assistant:

void JsonReporter::listTags( std::vector<TagInfo> const& tags ) {
        startListing();

        auto writer = m_objectWriters.top().write( "tags"_sr ).writeArray();
        for ( auto const& tag : tags ) {
            auto tag_writer = writer.writeObject();
            {
                auto aliases_writer =
                    tag_writer.write( "aliases"_sr ).writeArray();
                for ( auto alias : tag.spellings ) {
                    aliases_writer.write( alias );
                }
            }
            tag_writer.write( "count"_sr ).write( tag.count );
        }
    }